

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  LogMessage *pLVar4;
  char *__src;
  long lVar5;
  long lVar6;
  LogFinisher local_20a;
  byte local_209;
  LogMessage local_208;
  SubstituteArg *local_1d0;
  SubstituteArg *src;
  uint index_1;
  int i_1;
  char *target;
  int original_size;
  string local_190;
  LogMessage local_170;
  LogFinisher local_132;
  allocator<char> local_131;
  string local_130;
  string local_110;
  LogMessage local_e0;
  int local_a4;
  int local_a0;
  int index;
  int i;
  int size;
  SubstituteArg *args_array [11];
  SubstituteArg *arg3_local;
  SubstituteArg *arg2_local;
  SubstituteArg *arg1_local;
  SubstituteArg *arg0_local;
  char *format_local;
  string *output_local;
  
  args_array[3] = arg4;
  args_array[4] = arg5;
  args_array[5] = arg6;
  args_array[6] = arg7;
  args_array[7] = arg8;
  args_array[8] = arg9;
  args_array[9] = (SubstituteArg *)0x0;
  index = 0;
  local_a0 = 0;
  _i = arg0;
  args_array[0] = arg1;
  args_array[1] = arg2;
  args_array[2] = arg3;
  do {
    if (format[local_a0] == '\0') {
      if (index != 0) {
        target._0_4_ = std::__cxx11::string::size();
        STLStringResizeUninitialized(output,(long)((int)target + index));
        _index_1 = string_as_array(output);
        _index_1 = _index_1 + (int)target;
        for (src._4_4_ = 0; pcVar1 = _index_1, format[src._4_4_] != '\0'; src._4_4_ = src._4_4_ + 1)
        {
          if (format[src._4_4_] == '$') {
            bVar2 = ascii_isdigit(format[src._4_4_ + 1]);
            pcVar1 = _index_1;
            if (bVar2) {
              src._0_4_ = (int)format[src._4_4_ + 1] - 0x30;
              if (9 < (uint)src) {
                __assert_fail("index < 10",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                              ,0x75,
                              "void google::protobuf::strings::SubstituteAndAppend(string *, const char *, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &)"
                             );
              }
              local_1d0 = *(SubstituteArg **)(&i + (ulong)(uint)src * 2);
              __src = internal::SubstituteArg::data(local_1d0);
              iVar3 = internal::SubstituteArg::size(local_1d0);
              memcpy(pcVar1,__src,(long)iVar3);
              iVar3 = internal::SubstituteArg::size(local_1d0);
              src._4_4_ = src._4_4_ + 1;
              _index_1 = _index_1 + iVar3;
            }
            else if (format[src._4_4_ + 1] == '$') {
              *_index_1 = '$';
              src._4_4_ = src._4_4_ + 1;
              _index_1 = _index_1 + 1;
            }
          }
          else {
            *_index_1 = format[src._4_4_];
            _index_1 = _index_1 + 1;
          }
        }
        lVar5 = std::__cxx11::string::data();
        lVar6 = std::__cxx11::string::size();
        local_209 = 0;
        if ((long)pcVar1 - lVar5 != lVar6) {
          protobuf::internal::LogMessage::LogMessage
                    (&local_208,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                     ,0x83);
          local_209 = 1;
          pLVar4 = protobuf::internal::LogMessage::operator<<
                             (&local_208,
                              "CHECK failed: (target - output->data()) == (output->size()): ");
          protobuf::internal::LogFinisher::operator=(&local_20a,pLVar4);
        }
        if ((local_209 & 1) != 0) {
          protobuf::internal::LogMessage::~LogMessage(&local_208);
        }
      }
      return;
    }
    if (format[local_a0] == '$') {
      bVar2 = ascii_isdigit(format[local_a0 + 1]);
      if (bVar2) {
        local_a4 = format[local_a0 + 1] + -0x30;
        iVar3 = internal::SubstituteArg::size(*(SubstituteArg **)(&i + (long)local_a4 * 2));
        if (iVar3 == -1) {
          protobuf::internal::LogMessage::LogMessage
                    (&local_e0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                     ,0x54);
          pLVar4 = protobuf::internal::LogMessage::operator<<
                             (&local_e0,"strings::Substitute format string invalid: asked for \"$");
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,local_a4);
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,"\", but only ");
          iVar3 = CountSubstituteArgs((SubstituteArg **)&i);
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,iVar3);
          pLVar4 = protobuf::internal::LogMessage::operator<<
                             (pLVar4," args were given.  Full format string was: \"");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,format,&local_131)
          ;
          CEscape(&local_110,&local_130);
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,&local_110);
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,"\".");
          protobuf::internal::LogFinisher::operator=(&local_132,pLVar4);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator(&local_131);
          protobuf::internal::LogMessage::~LogMessage(&local_e0);
          return;
        }
        iVar3 = internal::SubstituteArg::size(*(SubstituteArg **)(&i + (long)local_a4 * 2));
        index = iVar3 + index;
      }
      else {
        if (format[local_a0 + 1] != '$') {
          protobuf::internal::LogMessage::LogMessage
                    (&local_170,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                     ,0x61);
          pLVar4 = protobuf::internal::LogMessage::operator<<
                             (&local_170,"Invalid strings::Substitute() format string: \"");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&original_size,format,(allocator<char> *)((long)&target + 7));
          CEscape(&local_190,(string *)&original_size);
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,&local_190);
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,"\".");
          protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&target + 6),pLVar4);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&original_size);
          std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
          protobuf::internal::LogMessage::~LogMessage(&local_170);
          return;
        }
        index = index + 1;
      }
      local_a0 = local_a0 + 1;
    }
    else {
      index = index + 1;
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, NULL
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}